

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O2

void __thiscall
chaiscript::AST_Node::AST_Node
          (AST_Node *this,string *t_ast_node_text,AST_Node_Type t_id,Parse_Location *t_loc)

{
  File_Position FVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  this->_vptr_AST_Node = (_func_int **)&PTR___cxa_pure_virtual_006a7100;
  this->identifier = t_id;
  std::__cxx11::string::string(&this->text,t_ast_node_text);
  FVar1 = t_loc->end;
  (this->location).start = t_loc->start;
  (this->location).end = FVar1;
  (this->location).filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (t_loc->filename).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  p_Var3 = (t_loc->filename).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->location).filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar2;
  (this->location).filename.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var3;
  (t_loc->filename).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  return;
}

Assistant:

AST_Node(std::string t_ast_node_text, AST_Node_Type t_id, Parse_Location t_loc)
        : identifier(t_id)
        , text(std::move(t_ast_node_text))
        , location(std::move(t_loc)) {
    }